

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# set_up_failure_tests.cpp
# Opt level: O0

void __thiscall TestTearDownFailure::TearDown(TestTearDownFailure *this)

{
  Fixed *fixed;
  AssertionHelper local_1d8;
  Fixed local_198;
  TestTearDownFailure *local_10;
  TestTearDownFailure *this_local;
  
  local_10 = this;
  memset(&local_198,0,0x188);
  iutest::AssertionHelper::Fixed::Fixed(&local_198);
  fixed = iutest::AssertionHelper::Fixed::operator<<(&local_198,(char (*) [17])"TearDown Failed.");
  iutest::AssertionHelper::AssertionHelper
            (&local_1d8,
             "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/set_up_failure_tests.cpp"
             ,0x2a,"Failed.\n",kFatalFailure);
  iutest::AssertionHelper::operator=(&local_1d8,fixed);
  iutest::AssertionHelper::~AssertionHelper(&local_1d8);
  iutest::AssertionHelper::Fixed::~Fixed(&local_198);
  return;
}

Assistant:

IUTEST_CXX_OVERRIDE IUTEST_CXX_FINAL
    {
        IUTEST_FAIL() << "TearDown Failed.";
    }